

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)3>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> _Var2;
  _Alloc_hider _Var3;
  pointer pPVar4;
  ClientContext *context_00;
  reference pvVar5;
  _Head_base<0UL,_duckdb::ParquetMetaDataBindData_*,_false> local_40;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_38;
  _Alloc_hider _Stack_30;
  
  local_40._M_head_impl = (ParquetMetaDataBindData *)operator_new(0x50);
  ((local_40._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)0x0;
  ((local_40._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_40._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_40._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_40._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ParquetMetaDataBindData_024748a8;
  ((local_40._M_head_impl)->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_40._M_head_impl)->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_40._M_head_impl)->return_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_40._M_head_impl)->file_list).internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ((local_40._M_head_impl)->file_list).internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_40._M_head_impl)->multi_file_reader).
  super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>.
  super__Head_base<0UL,_duckdb::MultiFileReader_*,_false> =
       (_Head_base<0UL,_duckdb::MultiFileReader_*,_false>)0x0;
  ParquetMetaDataOperatorData::BindFileMetaData(return_types,names);
  pPVar4 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                         *)&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &pPVar4->return_types,
             &return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  MultiFileReader::Create((MultiFileReader *)&local_38,input->table_function);
  pPVar4 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                         *)&local_40);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (MultiFileReader *)0x0;
  _Var1._M_head_impl =
       (pPVar4->multi_file_reader).
       super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
       .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl;
  (pPVar4->multi_file_reader).
  super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>.
  super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (MultiFileReader *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_MultiFileReader + 8))();
    if ((element_type *)local_38._M_head_impl != (element_type *)0x0) {
      (*(local_38._M_head_impl)->_vptr_MultiFileReader[1])();
    }
  }
  pPVar4 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                         *)&local_40);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->(&pPVar4->multi_file_reader);
  pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&local_38,context_00,(Value *)context,(FileGlobOptions)pvVar5);
  pPVar4 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                         *)&local_40);
  _Var3._M_p = _Stack_30._M_p;
  _Var1._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (MultiFileReader *)0x0;
  _Stack_30._M_p = (pointer)0x0;
  this_00 = (pPVar4->file_list).internal.
            super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pPVar4->file_list).internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)_Var1._M_head_impl;
  (pPVar4->file_list).internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_p);
    }
  }
  *(ParquetMetaDataBindData **)this = local_40._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ParquetMetaDataBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ParquetMetaDataBindData>();

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		ParquetMetaDataOperatorData::BindSchema(return_types, names);
		break;
	case ParquetMetadataOperatorType::META_DATA:
		ParquetMetaDataOperatorData::BindMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		ParquetMetaDataOperatorData::BindKeyValueMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		ParquetMetaDataOperatorData::BindFileMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto probe_bind_data = make_uniq<ParquetBloomProbeBindData>();
		D_ASSERT(input.inputs.size() == 3);
		if (input.inputs[1].IsNull() || input.inputs[2].IsNull()) {
			throw InvalidInputException("Can't have NULL parameters for parquet_bloom_probe");
		}
		probe_bind_data->probe_column_name = input.inputs[1].CastAs(context, LogicalType::VARCHAR).GetValue<string>();
		probe_bind_data->probe_constant = input.inputs[2];
		result = std::move(probe_bind_data);
		ParquetMetaDataOperatorData::BindBloomProbe(return_types, names);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	result->return_types = return_types;
	result->multi_file_reader = MultiFileReader::Create(input.table_function);
	result->file_list = result->multi_file_reader->CreateFileList(context, input.inputs[0]);

	return std::move(result);
}